

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTcPrsGramNodeOr::init_expansion(CTcPrsGramNodeOr *this)

{
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x40);
  (**(code **)(**(long **)(in_RDI + 0x50) + 0x40))();
  *(byte *)(in_RDI + 0x80) = *(byte *)(in_RDI + 0x80) & 0xfe;
  *(byte *)(in_RDI + 0x80) = *(byte *)(in_RDI + 0x80) & 0xfd | 2;
  return;
}

Assistant:

virtual void init_expansion()
    {
        /* start at the first alternative */
        cur_alt_ = sub_head_;

        /* initialize the first alternative for expansion */
        cur_alt_->init_expansion();

        /* we didn't just do an 'or' */
        just_did_or_ = FALSE;

        /* we haven't yet returned the first token */
        before_first_ = TRUE;
    }